

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O2

void __thiscall
xemmai::t_type_of<xemmai::t_module>::f_do_instantiate
          (t_type_of<xemmai::t_module> *this,t_pvalue *a_stack,size_t a_n)

{
  t_object *ptVar1;
  wstring_view a_message;
  wstring_view in_stack_00000000;
  
  if (a_n == 1) {
    f_check<xemmai::t_string>(a_stack[2].super_t_pointer.v_p,L"argument0");
    ptVar1 = t_module::f_instantiate(in_stack_00000000);
    (a_stack->super_t_pointer).v_p = ptVar1;
    return;
  }
  a_message._M_str = L"must be called with an argument.";
  a_message._M_len = 0x20;
  f_throw(a_message);
}

Assistant:

void t_type_of<t_module>::f_do_instantiate(t_pvalue* a_stack, size_t a_n)
{
	if (a_n != 1) f_throw(L"must be called with an argument."sv);
	f_check<t_string>(a_stack[2], L"argument0");
	a_stack[0] = t_module::f_instantiate(a_stack[2]->f_as<t_string>());
}